

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_compressionJob(void *jobDescription)

{
  ldmState_t *ldmState;
  BYTE *src;
  undefined4 uVar1;
  ZSTD_customMem customMem;
  int iVar2;
  uint uVar3;
  ZSTD_CCtx *cctx;
  size_t sVar5;
  unsigned_long_long *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  void *dst;
  pthread_mutex_t *ppVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  buffer_t bVar19;
  buffer_t buf;
  ZSTD_CCtx_params jobParams;
  void *local_188;
  undefined8 in_stack_fffffffffffffe80;
  pthread_mutex_t *ppVar20;
  undefined8 in_stack_fffffffffffffe88;
  void *pvVar21;
  void *in_stack_fffffffffffffe90;
  rawSeqStore_t local_128;
  ZSTD_CCtx_params local_100;
  rawSeq *prVar4;
  
  memcpy(&local_100,(void *)((long)jobDescription + 200),0xd0);
  ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar12);
  iVar2 = *(int *)((long)ppVar12 + 0x2c);
  if ((long)iVar2 == 0) {
    pthread_mutex_unlock(ppVar12);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe88;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe80;
    customMem.opaque = in_stack_fffffffffffffe90;
    cctx = ZSTD_createCCtx_advanced(customMem);
  }
  else {
    *(int *)((long)ppVar12 + 0x2c) = iVar2 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar12 + (long)iVar2 * 8 + 0x40);
    pthread_mutex_unlock(ppVar12);
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar4 = (rawSeq *)0x0;
    uVar9 = 0;
  }
  else {
    bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar4 = (rawSeq *)bVar19.start;
    uVar9 = bVar19.capacity / 0xc;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_001bab35:
    ppVar12 = (pthread_mutex_t *)((long)jobDescription + 0x10);
    pthread_mutex_lock(ppVar12);
    *(undefined8 *)((long)jobDescription + 8) = 0xffffffffffffffc0;
  }
  else {
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      if (bVar19.start == (void *)0x0) goto LAB_001bab35;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar19;
    }
    else {
      bVar19.capacity = *(size_t *)((long)jobDescription + 0x90);
      bVar19.start = *(void **)((long)jobDescription + 0x88);
    }
    dst = bVar19.start;
    if ((local_100.ldmParams.enableLdm == ZSTD_ps_enable) && (prVar4 == (rawSeq *)0x0))
    goto LAB_001bab35;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      local_100.fParams.checksumFlag = 0;
    }
    local_100.ldmParams.enableLdm = ZSTD_ps_disable;
    local_100.nbWorkers = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x198) == (ZSTD_CDict *)0x0) {
      bVar18 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar6 = (unsigned_long_long *)((long)jobDescription + 0x1a0);
      if (bVar18) {
        puVar6 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      local_100.forceWindow = (int)bVar18;
      if (bVar18) {
        local_100.deterministicRefPrefix = 0;
      }
      sVar5 = ZSTD_compressBegin_advanced_internal
                        (cctx,*(void **)((long)jobDescription + 0x98),
                         *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,ZSTD_dtlm_fast
                         ,(ZSTD_CDict *)0x0,&local_100,*puVar6);
      if (sVar5 < 0xffffffffffffff89) goto LAB_001bad6e;
LAB_001bb207:
      ppVar12 = (pthread_mutex_t *)((long)jobDescription + 0x10);
      pthread_mutex_lock(ppVar12);
      *(size_t *)((long)jobDescription + 8) = sVar5;
    }
    else {
      sVar5 = ZSTD_compressBegin_advanced_internal
                        (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                         *(ZSTD_CDict **)((long)jobDescription + 0x198),&local_100,
                         *(unsigned_long_long *)((long)jobDescription + 0x1a0));
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        __assert_fail("job->firstJob",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87a3,"void ZSTDMT_compressionJob(void *)");
      }
      if (0xffffffffffffff88 < sVar5) goto LAB_001bb207;
LAB_001bad6e:
      ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
      src = *(BYTE **)((long)jobDescription + 0xa8);
      uVar13 = *(uint *)((long)jobDescription + 0xb8);
      uVar16 = *(ulong *)((long)jobDescription + 0xb0);
      local_128.pos = 0;
      local_128.posInSequence = 0;
      local_128.size = 0;
      local_128.seq = prVar4;
      local_128.capacity = uVar9;
      pthread_mutex_lock(ppVar12);
      uVar3 = *(uint *)((long)ppVar12 + 0x9c0);
      if (uVar3 < uVar13) {
        do {
          pthread_cond_wait((pthread_cond_t *)(ppVar12 + 1),ppVar12);
          uVar3 = *(uint *)((long)ppVar12 + 0x9c0);
        } while (uVar3 < uVar13);
      }
      pvVar21 = dst;
      if (uVar3 == uVar13) {
        if (*(int *)((long)ppVar12 + 0xb8) == 1) {
          if ((((prVar4 == (rawSeq *)0x0) || (local_128.pos != 0)) || (local_128.size != 0)) ||
             (uVar9 == 0)) {
            __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x872a,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          if (*(ulong *)((long)ppVar12 + 0xa8) < uVar16) {
            __assert_fail("src.size <= serialState->params.jobSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x872b,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          ldmState = (ldmState_t *)((long)ppVar12 + 0x128);
          if (uVar16 != 0) {
            lVar8 = *(long *)((long)ppVar12 + 0x130);
            if (lVar8 == 0) {
              __assert_fail("window->base != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x48d8,
                            "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
            }
            if (*(long *)((long)ppVar12 + 0x138) == 0) {
              __assert_fail("window->dictBase != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x48d9,
                            "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
            }
            pBVar10 = (ldmState->window).nextSrc;
            if (pBVar10 == src) {
              uVar7 = (ulong)(uint)ppVar12[8].__data.__lock;
              lVar8 = *(long *)((long)ppVar12 + 0x138);
              uVar13 = *(uint *)((long)ppVar12 + 0x144);
            }
            else {
              uVar7 = (long)pBVar10 - lVar8;
              uVar13 = ppVar12[8].__data.__lock;
              *(uint *)((long)ppVar12 + 0x144) = uVar13;
              if (uVar7 >> 0x20 != 0) {
                __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x48e0,
                              "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
              }
              uVar3 = (uint)uVar7;
              ppVar12[8].__data.__lock = uVar3;
              *(long *)((long)ppVar12 + 0x138) = lVar8;
              *(ulong *)((long)ppVar12 + 0x130) = (long)src - uVar7;
              if (uVar3 - uVar13 < 8) {
                *(uint *)((long)ppVar12 + 0x144) = uVar3;
                uVar13 = uVar3;
              }
            }
            pBVar10 = src + uVar16;
            (ldmState->window).nextSrc = pBVar10;
            if (((BYTE *)((ulong)uVar13 + lVar8) < pBVar10) &&
               (src < (BYTE *)(lVar8 + (uVar7 & 0xffffffff)))) {
              uVar1 = (undefined4)((long)pBVar10 - lVar8);
              if ((long)(uVar7 & 0xffffffff) < (long)pBVar10 - lVar8) {
                uVar1 = (undefined4)uVar7;
              }
              *(undefined4 *)((long)ppVar12 + 0x144) = uVar1;
            }
          }
          sVar5 = ZSTD_ldm_generateSequences
                            (ldmState,&local_128,(ldmParams_t *)((long)ppVar12 + 0xb8),src,uVar16);
          if (0xffffffffffffff88 < sVar5) {
            __assert_fail("!ZSTD_isError(error)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8731,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          pthread_mutex_lock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
          *(BYTE **)((long)ppVar12 + 0xa20) = (ldmState->window).nextSrc;
          ppVar12[0x41].__align = *(long *)((long)ppVar12 + 0x130);
          *(undefined8 *)((long)ppVar12 + 0xa30) = *(undefined8 *)((long)ppVar12 + 0x138);
          *(long *)((long)ppVar12 + 0xa38) = ppVar12[8].__align;
          *(undefined8 *)((long)ppVar12 + 0xa40) = *(undefined8 *)((long)ppVar12 + 0x148);
          pthread_cond_signal((pthread_cond_t *)((long)ppVar12 + 0x9f0));
          pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
        }
        pvVar21 = dst;
        if (uVar16 != 0 && *(int *)((long)ppVar12 + 0x7c) != 0) {
          XXH_INLINE_XXH64_update((XXH_NAMESPACEXXH64_state_t *)((long)ppVar12 + 0x968),src,uVar16);
        }
      }
      *(int *)((long)ppVar12 + 0x9c0) = *(int *)((long)ppVar12 + 0x9c0) + 1;
      pthread_cond_broadcast((pthread_cond_t *)(ppVar12 + 1));
      pthread_mutex_unlock(ppVar12);
      if (local_128.size != 0) {
        if ((cctx->stage != ZSTDcs_init) ||
           ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable)) {
          if (*(int *)((long)ppVar12 + 0xb8) == 1) {
            __assert_fail("!ZSTD_isError(err)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8746,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
LAB_001bb36d:
          __assert_fail("serialState->params.ldmParams.enableLdm == ZSTD_ps_enable",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8745,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        (cctx->externSeqStore).seq = local_128.seq;
        (cctx->externSeqStore).size = local_128.size;
        (cctx->externSeqStore).capacity = local_128.size;
        (cctx->externSeqStore).pos = 0;
        (cctx->externSeqStore).posInSequence = 0;
        if (*(int *)((long)ppVar12 + 0xb8) != 1) goto LAB_001bb36d;
      }
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        sVar5 = ZSTD_compressContinue_internal
                          (cctx,dst,bVar19.capacity,*(void **)((long)jobDescription + 0xa8),0,1,0);
        if (0xffffffffffffff88 < sVar5) goto LAB_001bb207;
        ZSTD_invalidateRepCodes(cctx);
      }
      if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87c8,"void ZSTDMT_compressionJob(void *)");
      }
      if (*(long *)((long)jobDescription + 8) != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87ca,"void ZSTDMT_compressionJob(void *)");
      }
      uVar16 = *(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13;
      pvVar14 = (void *)(bVar19.capacity + (long)dst);
      local_188 = *(void **)((long)jobDescription + 0xa8);
      iVar2 = (int)uVar16;
      if (1 < iVar2) {
        lVar17 = uVar16 - 1;
        lVar8 = 0x80000;
        ppVar12 = (pthread_mutex_t *)((long)jobDescription + 0x10);
        dst = pvVar21;
        do {
          lVar15 = lVar8;
          sVar5 = ZSTD_compressContinue_internal
                            (cctx,dst,(long)pvVar14 - (long)dst,
                             (void *)((long)local_188 + lVar15 + -0x80000),0x80000,1,0);
          if (0xffffffffffffff88 < sVar5) {
            pthread_mutex_lock(ppVar12);
            *(size_t *)((long)jobDescription + 8) = sVar5;
            goto LAB_001bab49;
          }
          dst = (void *)((long)dst + sVar5);
          if (pvVar14 <= dst) {
            __assert_fail("op < oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x87cf,"void ZSTDMT_compressionJob(void *)");
          }
          ppVar20 = ppVar12;
          pthread_mutex_lock(ppVar12);
          *(long *)((long)jobDescription + 8) = *(long *)((long)jobDescription + 8) + sVar5;
          *(long *)jobDescription = lVar15;
          pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
          pthread_mutex_unlock(ppVar12);
          lVar17 = lVar17 + -1;
          lVar8 = lVar15 + 0x80000;
          ppVar12 = ppVar20;
        } while (lVar17 != 0);
        local_188 = (void *)((long)local_188 + lVar15);
      }
      if (iVar2 < 1 && *(int *)((long)jobDescription + 0xc0) == 0) {
        uVar16 = 0;
LAB_001bb26a:
        if ((*(int *)((long)jobDescription + 0xbc) == 0) &&
           ((cctx->blockState).matchState.window.lowLimit <
            (cctx->blockState).matchState.window.dictLimit)) {
          __assert_fail("!ZSTD_window_hasExtDict(cctx->blockState.matchState.window)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87e9,"void ZSTDMT_compressionJob(void *)");
        }
        goto LAB_001bab57;
      }
      uVar16 = *(ulong *)((long)jobDescription + 0xb0);
      uVar11 = (ulong)((uint)uVar16 & 0x7ffff);
      uVar7 = uVar11;
      if ((uVar16 & 0x7ffff) == 0) {
        uVar7 = 0x80000;
      }
      if (uVar16 < 0x80000) {
        uVar7 = uVar11;
      }
      if (*(int *)((long)jobDescription + 0xc0) == 0) {
        uVar16 = ZSTD_compressContinue_internal
                           (cctx,dst,(long)pvVar14 - (long)dst,local_188,uVar7,1,0);
      }
      else {
        uVar16 = ZSTD_compressEnd_public(cctx,dst,(long)pvVar14 - (long)dst,local_188,uVar7);
      }
      if (uVar16 < 0xffffffffffffff89) goto LAB_001bb26a;
      ppVar12 = (pthread_mutex_t *)((long)jobDescription + 0x10);
      pthread_mutex_lock(ppVar12);
      *(ulong *)((long)jobDescription + 8) = uVar16;
    }
  }
LAB_001bab49:
  pthread_mutex_unlock(ppVar12);
  uVar16 = 0;
LAB_001bab57:
  uVar7 = *(ulong *)((long)jobDescription + 8);
  ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
  uVar13 = *(uint *)((long)jobDescription + 0xb8);
  pthread_mutex_lock(ppVar12);
  if (*(uint *)((long)ppVar12 + 0x9c0) <= uVar13) {
    if (uVar7 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8750,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar12 + 0x9c0) = uVar13 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar12 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
    iVar2 = *(int *)((long)ppVar12 + 0xa20) - ppVar12[0x41].__data.__lock;
    *(int *)((long)ppVar12 + 0xa3c) = iVar2;
    *(int *)((long)ppVar12 + 0xa38) = iVar2;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar12 + 0x9f0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
  }
  pthread_mutex_unlock(ppVar12);
  buf.capacity = uVar9 * 0xc;
  buf.start = prVar4;
  ZSTDMT_releaseBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78),buf);
  if (cctx != (ZSTD_CCtx *)0x0) {
    ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
    pthread_mutex_lock(ppVar12);
    iVar2 = *(int *)((long)ppVar12 + 0x2c);
    if (iVar2 < ppVar12[1].__data.__lock) {
      *(int *)((long)ppVar12 + 0x2c) = iVar2 + 1;
      *(ZSTD_CCtx **)((long)ppVar12 + (long)iVar2 * 8 + 0x48) = cctx;
    }
    else {
      ZSTD_freeCCtx(cctx);
    }
    pthread_mutex_unlock(ppVar12);
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
  if (uVar16 != 0 && 0xffffffffffffff88 < *(ulong *)((long)jobDescription + 8)) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x87f7,"void ZSTDMT_compressionJob(void *)");
  }
  *(ulong *)((long)jobDescription + 8) = *(ulong *)((long)jobDescription + 8) + uVar16;
  *(undefined8 *)jobDescription = *(undefined8 *)((long)jobDescription + 0xb0);
  pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
  pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm == ZSTD_ps_enable && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = ZSTD_ps_disable;
    /* Correct nbWorkers to 0. */
    jobParams.nbWorkers = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        if (!job->firstJob) {
            size_t const err = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_deterministicRefPrefix, 0);
            if (ZSTD_isError(err)) JOB_ERROR(err);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue_public(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue_public(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd_public(cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue_public(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }
    if (!job->firstJob) {
        /* Double check that we don't have an ext-dict, because then our
         * repcode invalidation doesn't work.
         */
        assert(!ZSTD_window_hasExtDict(cctx->blockState.matchState.window));
    }
    ZSTD_CCtx_trace(cctx, 0);

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}